

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall
capnp::Orphan<capnp::DynamicStruct>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicStruct> *this)

{
  StructReader reader;
  StructSize size;
  StructReader local_48;
  Schema local_18;
  Orphan<capnp::DynamicStruct> *local_10;
  Orphan<capnp::DynamicStruct> *this_local;
  
  local_18.raw = (this->schema).super_Schema.raw;
  local_10 = this;
  size = anon_unknown_70::structSizeFromSchema((StructSchema)(this->schema).super_Schema.raw);
  _::OrphanBuilder::asStructReader(&local_48,&this->builder,size);
  reader.capTable = local_48.capTable;
  reader.segment = local_48.segment;
  reader.data = local_48.data;
  reader.pointers = local_48.pointers;
  reader.dataSize = local_48.dataSize;
  reader.pointerCount = local_48.pointerCount;
  reader._38_2_ = local_48._38_2_;
  reader.nestingLimit = local_48.nestingLimit;
  reader._44_4_ = local_48._44_4_;
  DynamicStruct::Reader::Reader(__return_storage_ptr__,(StructSchema)local_18.raw,reader);
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Reader Orphan<DynamicStruct>::getReader() const {
  return DynamicStruct::Reader(schema, builder.asStructReader(structSizeFromSchema(schema)));
}